

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3FixExpr(DbFixer *pFix,Expr *pExpr)

{
  int iVar1;
  Expr *local_20;
  Expr *pExpr_local;
  DbFixer *pFix_local;
  
  local_20 = pExpr;
  while( true ) {
    if (local_20 == (Expr *)0x0) {
      return 0;
    }
    if (local_20->op == 0x90) {
      if ((pFix->pParse->db->init).busy == '\0') {
        sqlite3ErrorMsg(pFix->pParse,"%s cannot use variables",pFix->zType);
        return 1;
      }
      local_20->op = 'n';
    }
    if ((local_20->flags & 0x804000) != 0) {
      return 0;
    }
    if ((local_20->flags & 0x800) == 0) {
      iVar1 = sqlite3FixExprList(pFix,(local_20->x).pList);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else {
      iVar1 = sqlite3FixSelect(pFix,(local_20->x).pSelect);
      if (iVar1 != 0) {
        return 1;
      }
    }
    iVar1 = sqlite3FixExpr(pFix,local_20->pRight);
    if (iVar1 != 0) break;
    local_20 = local_20->pLeft;
  }
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3FixExpr(
  DbFixer *pFix,     /* Context of the fixation */
  Expr *pExpr        /* The expression to be fixed to one database */
){
  while( pExpr ){
    if( pExpr->op==TK_VARIABLE ){
      if( pFix->pParse->db->init.busy ){
        pExpr->op = TK_NULL;
      }else{
        sqlite3ErrorMsg(pFix->pParse, "%s cannot use variables", pFix->zType);
        return 1;
      }
    }
    if( ExprHasProperty(pExpr, EP_TokenOnly|EP_Leaf) ) break;
    if( ExprHasProperty(pExpr, EP_xIsSelect) ){
      if( sqlite3FixSelect(pFix, pExpr->x.pSelect) ) return 1;
    }else{
      if( sqlite3FixExprList(pFix, pExpr->x.pList) ) return 1;
    }
    if( sqlite3FixExpr(pFix, pExpr->pRight) ){
      return 1;
    }
    pExpr = pExpr->pLeft;
  }
  return 0;
}